

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpBrEnvProperty
               (OpCode op,OpLayoutBrEnvProperty *data,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar1;
  
  DumpOffset((int)data->RelativeJumpOffset,reader);
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,data->PropertyIdIndex);
  pPVar1 = ScriptContext::GetPropertyName(this,propertyId);
  Output::Print(L"[%d].%s",(ulong)(uint)data->SlotIndex,pPVar1 + 1);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrEnvProperty(OpCode op, const unaligned OpLayoutBrEnvProperty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        Output::Print(_u("[%d].%s"), data->SlotIndex, pPropertyName->GetBuffer());
    }